

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::InvalidFunctionCall::~InvalidFunctionCall(InvalidFunctionCall *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit InvalidFunctionCall(std::string_view message = "invalid function call") noexcept:
        HelicsException(message)
    {
    }